

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::IncludeGuard_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view filename)

{
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  string sStack_c8;
  string local_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  s._M_len = filename._M_len;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_88,(char (*) [2])0x2d97d4,(char (*) [2])0x3703cd);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_68,(char (*) [2])0x346490,(char (*) [2])0x3703cd);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_48,(char (*) [2])0x38bcf9,(char (*) [2])0x3703cd);
  s._M_str = (char *)&local_88;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_a8,(lts_20250127 *)this,s,replacements);
  absl::lts_20250127::AsciiStrToUpper<>(&sStack_c8,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::operator+(__return_storage_ptr__,&sStack_c8,"_UPB_H_");
  std::__cxx11::string::~string((string *)&sStack_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string IncludeGuard(absl::string_view filename) {
  return ToPreproc(filename) + "_UPB_H_";
}